

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generator.cc
# Opt level: O0

void __thiscall generator_fsm_Test::TestBody(generator_fsm_Test *this)

{
  Generator *pGVar1;
  Port *pPVar2;
  FSM *pFVar3;
  Const *pCVar4;
  element_type *peVar5;
  Generator *top;
  undefined1 local_360 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_src;
  enable_shared_from_this<kratos::Var> local_320;
  enable_shared_from_this<kratos::Var> local_310;
  enable_shared_from_this<kratos::Var> local_300;
  undefined1 local_2f0 [8];
  shared_ptr<kratos::Var> expr2;
  shared_ptr<kratos::Var> expr1;
  string local_2c8 [32];
  undefined1 local_2a8 [8];
  shared_ptr<kratos::FSMState> blue;
  string local_290 [32];
  undefined1 local_270 [8];
  shared_ptr<kratos::FSMState> red;
  allocator<char> local_249;
  string local_248;
  FSM *local_228;
  FSM *fsm;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  Port *local_1a8;
  Port *in_;
  string local_198;
  Port *local_178;
  Port *out_;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context c;
  generator_fsm_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar1 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"out",(allocator<char> *)((long)&in_ + 7));
  pPVar2 = kratos::Generator::port(pGVar1,Out,&local_198,2);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in_ + 7));
  pGVar1 = local_138;
  local_178 = pPVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"in",&local_1c9);
  pPVar2 = kratos::Generator::port(pGVar1,In,&local_1c8,2);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pGVar1 = local_138;
  local_1a8 = pPVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"clk",&local_1f1);
  kratos::Generator::port(pGVar1,In,&local_1f0,1,1,Clock,false);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  pGVar1 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"rst",(allocator<char> *)((long)&fsm + 7));
  kratos::Generator::port(pGVar1,In,&local_218,1,1,AsyncReset,false);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fsm + 7));
  pGVar1 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Color",&local_249);
  pFVar3 = kratos::Generator::fsm(pGVar1,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  local_228 = pFVar3;
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::FSM::output(pFVar3,(shared_ptr<kratos::Var> *)
                             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pFVar3 = local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_290,"Red",
             (allocator<char> *)
             ((long)&blue.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  kratos::FSM::add_state((FSM *)local_270,&pFVar3->fsm_name_);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&blue.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pFVar3 = local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2c8,"Blue",
             (allocator<char> *)
             ((long)&expr1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  kratos::FSM::add_state((FSM *)local_2a8,&pFVar3->fsm_name_);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expr1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  pPVar2 = local_1a8;
  pCVar4 = kratos::constant(0,2,false);
  kratos::Var::eq(&pPVar2->super_Var,&pCVar4->super_Var);
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &expr2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar5 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_270);
  kratos::FSMState::next
            (peVar5,(shared_ptr<kratos::FSMState> *)local_270,
             (shared_ptr<kratos::Var> *)
             &expr2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pPVar2 = local_1a8;
  pCVar4 = kratos::constant(1,2,false);
  kratos::Var::eq(&pPVar2->super_Var,&pCVar4->super_Var);
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)local_2f0);
  peVar5 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_270);
  kratos::FSMState::next
            (peVar5,(shared_ptr<kratos::FSMState> *)local_2a8,(shared_ptr<kratos::Var> *)local_2f0);
  peVar5 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_2a8);
  kratos::FSMState::next
            (peVar5,(shared_ptr<kratos::FSMState> *)local_270,(shared_ptr<kratos::Var> *)local_2f0);
  peVar5 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_270);
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_300);
  kratos::constant(2,2,false);
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_310);
  kratos::FSMState::output
            (peVar5,(shared_ptr<kratos::Var> *)&local_300,(shared_ptr<kratos::Var> *)&local_310);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_310);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_300);
  peVar5 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_2a8);
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_320);
  kratos::constant(1,2,false);
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &mod_src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  kratos::FSMState::output
            (peVar5,(shared_ptr<kratos::Var> *)&local_320,
             (shared_ptr<kratos::Var> *)&mod_src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)&mod_src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_320);
  kratos::FSM::set_start_state(local_228,(shared_ptr<kratos::FSMState> *)local_270);
  kratos::realize_fsm(local_138);
  kratos::fix_assignment_type(local_138);
  kratos::verify_generator_connectivity(local_138);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_360,(kratos *)local_138,top);
  kratos::is_valid_verilog
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_360);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_360);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_2f0);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &expr2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<kratos::FSMState>::~shared_ptr((shared_ptr<kratos::FSMState> *)local_2a8);
  std::shared_ptr<kratos::FSMState>::~shared_ptr((shared_ptr<kratos::FSMState> *)local_270);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(generator, fsm) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &out_ = mod.port(PortDirection::Out, "out", 2);
    auto &in_ = mod.port(PortDirection::In, "in", 2);
    mod.port(PortDirection::In, "clk", 1, 1, PortType::Clock, false);
    mod.port(PortDirection::In, "rst", 1, 1, PortType::AsyncReset, false);

    auto &fsm = mod.fsm("Color");
    fsm.output(out_.shared_from_this());

    auto red = fsm.add_state("Red");
    auto blue = fsm.add_state("Blue");
    auto expr1 = in_.eq(constant(0, 2)).shared_from_this();
    red->next(red, expr1);
    auto expr2 = in_.eq(constant(1, 2)).shared_from_this();
    red->next(blue, expr2);
    blue->next(red, expr2);

    red->output(out_.shared_from_this(), constant(2, 2).shared_from_this());
    blue->output(out_.shared_from_this(), constant(1, 2).shared_from_this());
    fsm.set_start_state(red);

    realize_fsm(&mod);
    fix_assignment_type(&mod);
    verify_generator_connectivity(&mod);
    auto mod_src = generate_verilog(&mod);
    is_valid_verilog(mod_src);
}